

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O0

int sfp_get_vendor_revision(tcv_t *tcv,char *rev)

{
  char *rev_local;
  tcv_t *tcv_local;
  
  if (((tcv == (tcv_t *)0x0) || (rev == (char *)0x0)) || (tcv->data == (void *)0x0)) {
    tcv_local._4_4_ = -4;
  }
  else {
    rev[4] = '\0';
    *(undefined4 *)rev = *(undefined4 *)((long)tcv->data + 0x39);
    tcv_local._4_4_ = 0;
  }
  return tcv_local._4_4_;
}

Assistant:

int sfp_get_vendor_revision(tcv_t *tcv, char rev[BASIC_INFO_REG_VENDOR_REV_SIZE + 1])
{
	if (tcv == NULL || rev == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Indicates end of string */
	rev[BASIC_INFO_REG_VENDOR_REV_SIZE] = '\0';

	memcpy(rev, &((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_VENDOR_REV], BASIC_INFO_REG_VENDOR_REV_SIZE);

	return 0;
}